

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O3

int state_align_search_step(ps_search_t *search,int frame_idx)

{
  uint uVar1;
  acmod_t *acmod;
  char *pcVar2;
  ps_searchfuncs_t *ppVar3;
  uint uVar4;
  int32 iVar5;
  int iVar6;
  _func_int_ps_search_t_ptr *p_Var7;
  ulong uVar8;
  dict2pid_t *pdVar9;
  int *piVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint local_34;
  
  acmod = search->acmod;
  iVar14 = *(int *)&search[1].acmod;
  local_34 = frame_idx;
  if (0 < iVar14) {
    lVar17 = 0;
    lVar16 = 0;
    do {
      if (*(int *)(search[1].name + lVar17 + 0x4c) == frame_idx) {
        acmod_activate_hmm(acmod,(hmm_t *)(search[1].name + lVar17));
        iVar14 = *(int *)&search[1].acmod;
      }
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0x58;
    } while (lVar16 < iVar14);
  }
  p_Var7 = (_func_int_ps_search_t_ptr *)acmod_score(acmod,(int *)&local_34);
  if (*(int *)&search[1].dict < -0x1fd00000) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
            ,0xc1,"Renormalizing Scores at frame %d, best score %d\n",(ulong)local_34);
    if (0 < *(int *)&search[1].acmod) {
      iVar5 = *(int32 *)&search[1].dict;
      lVar17 = 0;
      lVar16 = 0;
      do {
        hmm_normalize((hmm_t *)(search[1].name + lVar17),iVar5);
        lVar16 = lVar16 + 1;
        uVar8 = (ulong)*(int *)&search[1].acmod;
        lVar17 = lVar17 + 0x58;
      } while (lVar16 < (long)uVar8);
      goto LAB_001143ea;
    }
    (search[1].vt)->finish = p_Var7;
  }
  else {
    uVar8 = (ulong)*(uint *)&search[1].acmod;
LAB_001143ea:
    uVar4 = local_34;
    (search[1].vt)->finish = p_Var7;
    if (0 < (int)uVar8) {
      iVar14 = -0x20000000;
      lVar16 = 0;
      lVar17 = 0;
      do {
        if ((int)uVar4 <= *(int *)(search[1].name + lVar16 + 0x4c)) {
          iVar5 = hmm_vit_eval((hmm_t *)(search[1].name + lVar16));
          if (iVar14 < iVar5) {
            iVar14 = iVar5;
          }
          uVar8 = (ulong)*(uint *)&search[1].acmod;
        }
        uVar1 = local_34;
        lVar17 = lVar17 + 1;
        iVar6 = (int)uVar8;
        lVar16 = lVar16 + 0x58;
      } while (lVar17 < iVar6);
      *(int *)&search[1].dict = iVar14;
      if (0 < iVar6) {
        piVar10 = (int *)(search[1].name + 0x4c);
        uVar12 = 0;
        do {
          if (((int)local_34 <= *piVar10) &&
             ((int)local_34 < (&(search[1].config)->refcount)[uVar12])) {
            *piVar10 = local_34 + 1;
          }
          uVar12 = uVar12 + 1;
          piVar10 = piVar10 + 0x16;
        } while ((uVar8 & 0xffffffff) != uVar12);
        if (iVar6 != 1) {
          iVar14 = local_34 + 1;
          lVar16 = 0x58;
          lVar17 = 0;
          do {
            pcVar11 = search[1].name;
            if (((*(int *)(pcVar11 + lVar16 + -0xc) == iVar14) &&
                (*(int *)((long)&(search[1].pls)->vt + lVar17 * 4 + 4) <= iVar14)) &&
               ((*(int *)(pcVar11 + lVar16 + 0x4c) < (int)uVar1 ||
                (*(int *)(pcVar11 + lVar16 + 8) < *(int32 *)(pcVar11 + lVar16 + -0x28))))) {
              hmm_enter((hmm_t *)(pcVar11 + lVar16),*(int32 *)(pcVar11 + lVar16 + -0x28),
                        *(int32 *)(pcVar11 + lVar16 + -0x24),iVar14);
              uVar8 = (ulong)*(uint *)&search[1].acmod;
            }
            lVar17 = lVar17 + 1;
            lVar16 = lVar16 + 0x58;
          } while (lVar17 < (int)uVar8 + -1);
        }
      }
      goto LAB_00114515;
    }
  }
  *(undefined4 *)&search[1].dict = 0xe0000000;
LAB_00114515:
  uVar4 = local_34;
  lVar16 = (long)(int)local_34;
  if ((int)local_34 < *(int *)&search[1].hyp_str) {
    pdVar9 = search[1].d2p;
  }
  else {
    *(int *)&search[1].hyp_str = (int)(lVar16 + 0x15);
    pdVar9 = (dict2pid_t *)
             __ckd_realloc__(search[1].d2p,
                             (long)*(int *)((long)&search[1].dict + 4) * (lVar16 + 0x15) * 8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                             ,0x8d);
    search[1].d2p = pdVar9;
  }
  lVar17 = (long)*(int *)((long)&search[1].dict + 4);
  memset(&pdVar9->refcount + lVar17 * lVar16 * 2,0xff,lVar17 << 3);
  iVar14 = *(int *)&search[1].acmod;
  if (0 < iVar14) {
    lVar16 = *(int *)((long)&search[1].dict + 4) * lVar16;
    pdVar9 = search[1].d2p;
    pcVar2 = search[1].name;
    pcVar11 = pcVar2 + 0x1c;
    lVar17 = 0;
    do {
      if ((int)uVar4 <= *(int *)(pcVar2 + lVar17 * 0x58 + 0x4c)) {
        ppVar3 = search[1].vt;
        uVar1 = *(uint *)&ppVar3->start;
        uVar8 = (ulong)uVar1;
        if (0 < (int)uVar1) {
          lVar13 = 0;
          do {
            iVar14 = (int)uVar8 * (int)lVar17;
            lVar15 = iVar14 + lVar13;
            (&pdVar9->refcount)[lVar16 * 2 + lVar15 * 2] = *(int *)(pcVar11 + lVar13 * 4);
            *(undefined4 *)(&pdVar9->field_0x4 + lVar15 * 8 + lVar16 * 8) =
                 *(undefined4 *)(pcVar11 + lVar13 * 4 + -0x14);
            *(int *)(pcVar11 + lVar13 * 4) = (int)lVar13 + iVar14;
            lVar13 = lVar13 + 1;
            uVar8 = (ulong)*(int *)&ppVar3->start;
          } while (lVar13 < (long)uVar8);
          iVar14 = *(int *)&search[1].acmod;
        }
      }
      lVar17 = lVar17 + 1;
      pcVar11 = pcVar11 + 0x58;
    } while (lVar17 < iVar14);
  }
  *(uint *)((long)&search[1].acmod + 4) = local_34;
  return 0;
}

Assistant:

static int
state_align_search_step(ps_search_t *search, int frame_idx)
{
    state_align_search_t *sas = (state_align_search_t *)search;
    acmod_t *acmod = ps_search_acmod(search);
    int16 const *senscr;
    int i;

    /* Calculate senone scores. */
    for (i = 0; i < sas->n_phones; ++i)
        if (hmm_frame(&sas->hmms[i]) == frame_idx)
            acmod_activate_hmm(acmod, &sas->hmms[i]);
    senscr = acmod_score(acmod, &frame_idx);

    /* Renormalize here if needed. */
    /* FIXME: Make sure to (unit-)test this!!! */
    if ((sas->best_score - 0x300000) WORSE_THAN WORST_SCORE) {
        E_INFO("Renormalizing Scores at frame %d, best score %d\n",
               frame_idx, sas->best_score);
        renormalize_hmms(sas, frame_idx, sas->best_score);
    }

    /* Viterbi step. */
    sas->best_score = evaluate_hmms(sas, senscr, frame_idx);
    prune_hmms(sas, frame_idx);

    /* Transition out of non-emitting states. */
    phone_transition(sas, frame_idx);

    /* Generate new tokens from best path results. */
    record_transitions(sas, frame_idx);

    /* Update frame counter */
    sas->frame = frame_idx;

    return 0;
}